

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_mode_test.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ReflectionModeTest_UglyNestedScopedReflection_Test::
~ReflectionModeTest_UglyNestedScopedReflection_Test
          (ReflectionModeTest_UglyNestedScopedReflection_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ReflectionModeTest, UglyNestedScopedReflection) {
  ASSERT_EQ(ScopedReflectionMode::current_reflection_mode(),
            ReflectionMode::kDefault);
  ScopedReflectionMode scope1(ReflectionMode::kDebugString);
  EXPECT_EQ(ScopedReflectionMode::current_reflection_mode(),
            ReflectionMode::kDebugString);
  ScopedReflectionMode scope2(ReflectionMode::kDiagnostics);
  EXPECT_EQ(ScopedReflectionMode::current_reflection_mode(),
            ReflectionMode::kDiagnostics);
}